

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peerman_tests.cpp
# Opt level: O0

void __thiscall
peerman_tests::connections_desirable_service_flags::test_method
          (connections_desirable_service_flags *this)

{
  uint uVar1;
  Options opts;
  bool bVar2;
  int iVar3;
  ChainstateManager *this_00;
  pointer pPVar4;
  CBlockIndex *pCVar5;
  seconds block_time;
  undefined4 extraout_var;
  long in_RDI;
  long in_FS_OFFSET;
  int tip_block_height;
  CBlockIndex *tip;
  ServiceFlags peer_flags;
  uint64_t tip_block_time;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> peerman;
  Params consensus;
  lazy_ostream *prev;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *in_stack_fffffffffffff8b8;
  assertion_result *this_01;
  seconds in_stack_fffffffffffff8c8;
  undefined7 in_stack_fffffffffffff8d0;
  undefined1 in_stack_fffffffffffff8d7;
  Params *in_stack_fffffffffffff8d8;
  CConnman *in_stack_fffffffffffff8e0;
  unit_test_log_t *in_stack_fffffffffffff8e8;
  unit_test_log_t *this_02;
  BanMan *in_stack_fffffffffffff8f8;
  NodeContext *in_stack_fffffffffffff910;
  undefined8 in_stack_fffffffffffff918;
  undefined8 in_stack_fffffffffffff920;
  uint32_t in_stack_fffffffffffff928;
  const_string local_550 [2];
  lazy_ostream local_530 [2];
  assertion_result local_510 [2];
  long local_4d8;
  rep local_4c8;
  const_string local_4c0 [2];
  lazy_ostream local_4a0 [2];
  assertion_result local_480 [2];
  const_string local_448 [2];
  lazy_ostream local_428 [2];
  assertion_result local_408 [2];
  long local_3d0;
  const_string local_3c0 [2];
  lazy_ostream local_3a0 [2];
  assertion_result local_380 [2];
  long local_348;
  rep local_338;
  const_string local_330 [2];
  lazy_ostream local_310 [2];
  assertion_result local_2f0 [2];
  long local_2b8;
  rep local_2a8;
  const_string local_2a0 [2];
  lazy_ostream local_280 [2];
  assertion_result local_260 [2];
  undefined8 local_228;
  int64_t local_220;
  const_string local_210 [2];
  lazy_ostream local_1f0 [2];
  assertion_result local_1d0 [2];
  undefined1 local_198;
  undefined1 uStack_197;
  ushort uStack_196;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined1 uStack_18c;
  undefined1 uStack_18b;
  undefined2 uStack_18a;
  undefined4 local_188;
  long local_78;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<CConnman,_std::default_delete<CConnman>_>::operator*
            ((unique_ptr<CConnman,_std::default_delete<CConnman>_> *)in_stack_fffffffffffff8b8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*(in_stack_fffffffffffff8b8);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff8b8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_fffffffffffff8b8);
  this_00 = (ChainstateManager *)
            std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator*
                      ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                       in_stack_fffffffffffff8b8);
  local_198 = 0;
  uStack_197 = 0;
  uStack_194 = 100;
  uStack_190 = 100;
  uStack_18c = 0;
  uStack_18b = 0;
  local_188 = 2000;
  prev = (lazy_ostream *)CONCAT44(100,(uint)uStack_196 << 0x10);
  this_01 = (assertion_result *)CONCAT26(uStack_18a,100);
  opts.max_extra_txs = (int)in_stack_fffffffffffff920;
  opts.capture_messages = (bool)(char)((ulong)in_stack_fffffffffffff920 >> 0x20);
  opts.deterministic_rng = (bool)(char)((ulong)in_stack_fffffffffffff920 >> 0x28);
  opts._14_2_ = (short)((ulong)in_stack_fffffffffffff920 >> 0x30);
  opts.ignore_incoming_txs = (bool)(char)in_stack_fffffffffffff918;
  opts.reconcile_txs = (bool)(char)((ulong)in_stack_fffffffffffff918 >> 8);
  opts._2_2_ = (short)((ulong)in_stack_fffffffffffff918 >> 0x10);
  opts.max_orphan_txs = (int)((ulong)in_stack_fffffffffffff918 >> 0x20);
  opts.max_headers_result = in_stack_fffffffffffff928;
  PeerManager::make(in_stack_fffffffffffff8e0,(AddrMan *)in_stack_fffffffffffff8d8,
                    in_stack_fffffffffffff8f8,
                    (ChainstateManager *)
                    CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0),
                    (CTxMemPool *)in_stack_fffffffffffff8c8.__r,
                    (Warnings *)in_stack_fffffffffffff910,opts);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)this_00);
  ChainstateManager::GetParams(this_00);
  CChainParams::GetConsensus((CChainParams *)this_00);
  Consensus::Params::Params
            (in_stack_fffffffffffff8d8,
             (Params *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff8e8,(const_string *)in_stack_fffffffffffff8e0,
               (size_t)in_stack_fffffffffffff8d8,
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x17])(pPVar4,0x408);
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d0,local_1f0,local_210,0x28,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)this_00);
  pCVar5 = test_method::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff8d8);
  local_220 = CBlockIndex::GetBlockTime((CBlockIndex *)this_00);
  uVar1 = pCVar5->nHeight;
  pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)this_00,(unsigned_long *)0x8f041f);
  (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x12])
            (pPVar4,(ulong)uVar1,local_228);
  SetMockTime((int64_t)this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff8e8,(const_string *)in_stack_fffffffffffff8e0,
               (size_t)in_stack_fffffffffffff8d8,
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x17])(pPVar4,0x408);
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_260,local_280,local_2a0,0x31,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_2a8 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  local_2b8 = local_78 * 0x8f;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)this_00,(long *)0x8f062a);
  std::chrono::operator+
            ((duration<long,_std::ratio<1L,_1L>_> *)this_01,
             (duration<long,_std::ratio<1L,_1L>_> *)prev);
  SetMockTime(in_stack_fffffffffffff8c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff8e8,(const_string *)in_stack_fffffffffffff8e0,
               (size_t)in_stack_fffffffffffff8d8,
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x17])(pPVar4,0x408);
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2f0,local_310,local_330,0x35,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_338 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  local_348 = local_78 * 2;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)this_00,(long *)0x8f0838);
  std::chrono::operator+
            ((duration<long,_std::ratio<1L,_1L>_> *)this_01,
             (duration<long,_std::ratio<1L,_1L>_> *)prev);
  SetMockTime(in_stack_fffffffffffff8c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff8e8,(const_string *)in_stack_fffffffffffff8e0,
               (size_t)in_stack_fffffffffffff8d8,
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x17])(pPVar4,0x408);
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_380,local_3a0,local_3c0,0x39,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)this_00);
  std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::get
            ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
  ValidationSignals::RegisterValidationInterface
            ((ValidationSignals *)in_stack_fffffffffffff8d8,
             (CValidationInterface *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
  block_time.__r = in_RDI + 0x10;
  local_3d0 = local_220 + 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<unsigned_long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)this_00,(unsigned_long *)0x8f0a74);
  mineBlock(in_stack_fffffffffffff910,block_time);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff8e8,(const_string *)in_stack_fffffffffffff8e0,
               (size_t)in_stack_fffffffffffff8d8,
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x17])(pPVar4,0x408);
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_408,local_428,local_448,0x42,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  mineBlock(in_stack_fffffffffffff910,block_time);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff8e8,(const_string *)in_stack_fffffffffffff8e0,
               (size_t)in_stack_fffffffffffff8d8,
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x17])(pPVar4,0x408);
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)prev >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_480,local_4a0,local_4c0,0x46,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_4c8 = (rep)GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
  local_4d8 = local_78 * 0x90 + 1;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,_std::ratio<1L,_1L>_> *)this_00,(long *)0x8f0e0c);
  std::chrono::operator+
            ((duration<long,_std::ratio<1L,_1L>_> *)this_01,
             (duration<long,_std::ratio<1L,_1L>_> *)prev);
  SetMockTime(in_stack_fffffffffffff8c8);
  do {
    this_02 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_02,(const_string *)in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8,
               (const_string *)CONCAT17(in_stack_fffffffffffff8d7,in_stack_fffffffffffff8d0));
    pPVar4 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_00);
    iVar3 = (*(pPVar4->super_CValidationInterface)._vptr_CValidationInterface[0x17])(pPVar4,0x408);
    in_stack_fffffffffffff8e0 = (CConnman *)CONCAT44(extraout_var,iVar3);
    boost::test_tools::assertion_result::assertion_result(this_01,SUB81((ulong)prev >> 0x38,0));
    in_stack_fffffffffffff8d8 = (Params *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_01,(pointer)prev,(unsigned_long)this_00);
    this_00 = (ChainstateManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_510,local_530,local_550,0x4a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    in_stack_fffffffffffff8d7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff8d7);
  Consensus::Params::~Params((Params *)this_00);
  std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::~unique_ptr
            ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(connections_desirable_service_flags)
{
    std::unique_ptr<PeerManager> peerman = PeerManager::make(*m_node.connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});
    auto consensus = m_node.chainman->GetParams().GetConsensus();

    // Check we start connecting to full nodes
    ServiceFlags peer_flags{NODE_WITNESS | NODE_NETWORK_LIMITED};
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));

    // Make peerman aware of the initial best block and verify we accept limited peers when we start close to the tip time.
    auto tip = WITH_LOCK(::cs_main, return m_node.chainman->ActiveChain().Tip());
    uint64_t tip_block_time = tip->GetBlockTime();
    int tip_block_height = tip->nHeight;
    peerman->SetBestBlock(tip_block_height, std::chrono::seconds{tip_block_time});

    SetMockTime(tip_block_time + 1); // Set node time to tip time
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS));

    // Check we don't disallow limited peers connections when we are behind but still recoverable (below the connection safety window)
    SetMockTime(GetTime<std::chrono::seconds>() + std::chrono::seconds{consensus.nPowTargetSpacing * (NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS - 1)});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS));

    // Check we disallow limited peers connections when we are further than the limited peers safety window
    SetMockTime(GetTime<std::chrono::seconds>() + std::chrono::seconds{consensus.nPowTargetSpacing * 2});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));

    // By now, we tested that the connections desirable services flags change based on the node's time proximity to the tip.
    // Now, perform the same tests for when the node receives a block.
    m_node.validation_signals->RegisterValidationInterface(peerman.get());

    // First, verify a block in the past doesn't enable limited peers connections
    // At this point, our time is (NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS + 1) * 10 minutes ahead the tip's time.
    mineBlock(m_node, /*block_time=*/std::chrono::seconds{tip_block_time + 1});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));

    // Verify a block close to the tip enables limited peers connections
    mineBlock(m_node, /*block_time=*/GetTime<std::chrono::seconds>());
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK_LIMITED | NODE_WITNESS));

    // Lastly, verify the stale tip checks can disallow limited peers connections after not receiving blocks for a prolonged period.
    SetMockTime(GetTime<std::chrono::seconds>() + std::chrono::seconds{consensus.nPowTargetSpacing * NODE_NETWORK_LIMITED_ALLOW_CONN_BLOCKS + 1});
    BOOST_CHECK(peerman->GetDesirableServiceFlags(peer_flags) == ServiceFlags(NODE_NETWORK | NODE_WITNESS));
}